

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O2

void __thiscall Start::StartGameNow(Start *this,double *credits,uint *bet)

{
  int iVar1;
  ostream *poVar2;
  Start *this_00;
  char cVar3;
  string p;
  CreditField addCreditBeforeExit;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  Bet settingBet;
  PaytableSuperFire paytableForGame;
  char *local_f8;
  long local_f0;
  char local_e8 [16];
  Start *local_d8;
  CreditField local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  SelectGame local_a8;
  PaytableSuperFire local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = this;
  Matrix::getVectorMatrix(&local_88._myVectorInPaytableSuperFire,&this->super_Matrix);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&local_c8,&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88._myVectorInPaytableSuperFire);
  local_f8 = local_e8;
  local_f0 = 0;
  local_e8[0] = '\0';
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,&local_c8);
  PaytableSuperFire::PaytableSuperFire(&local_88,&local_60,*credits,*bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  while (1.0 <= *credits) {
    if (*credits < (double)*bet) {
      *bet = 1;
      poVar2 = std::operator<<((ostream *)&std::cout,"Changing Bet to min: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," Euro!");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'p\' to Start a Game!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'e\' to Change the Bet!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'i\' to see the Paytable!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'c\' to Cashout!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'a\' to add credit!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'q\' for More Games!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar2 = std::ostream::_M_insert<double>(*credits);
    poVar2 = std::operator<<(poVar2," Euro!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator>>((istream *)&std::cin,(string *)&local_f8);
    cVar3 = *local_f8;
    if (local_f0 == 1 && cVar3 == 'p') {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      *credits = *credits - (double)*bet;
      Matrix::RandomNumbersInMatrix(&local_48,&local_d8->super_Matrix,&local_c8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      std::endl<char,std::char_traits<char>>(poVar2);
      Matrix::outPutMatrix(&local_d8->super_Matrix,&local_c8);
      this_00 = (Start *)std::operator<<((ostream *)&std::cout,
                                         "---------------------------------------------");
      std::endl<char,std::char_traits<char>>((ostream *)this_00);
      checkForCreditsAndBet(this_00,credits,bet);
      outputCreditsAndBetCurrent(this_00,credits,bet);
      PaytableSuperFire::PaytableSuperFireWin(&local_88,&local_c8,credits,bet);
      cVar3 = *local_f8;
    }
    if (local_f0 == 1 && cVar3 == 'e') {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&local_a8,*bet,*credits);
      Bet::selectBet((Bet *)&local_a8,bet,credits);
      Bet::~Bet((Bet *)&local_a8);
      cVar3 = *local_f8;
    }
    if ((cVar3 == 'i') && (local_f0 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      PaytableSuperFire::PaytableSuperFireInfo(&local_88);
      cVar3 = *local_f8;
    }
    if ((cVar3 == 'c') && (local_f0 == 1)) {
      if (*credits <= 0.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar2 = std::ostream::_M_insert<double>(*credits);
        poVar2 = std::operator<<(poVar2," Euro!");
        std::endl<char,std::char_traits<char>>(poVar2);
        *credits = 0.0;
      }
    }
    cVar3 = *local_f8;
    if (local_f0 == 1 && cVar3 == 'g') {
      Gamble::Gamble((Gamble *)&local_a8);
      Gamble::GambleInfoScreen((Gamble *)&local_a8);
      Gamble::~Gamble((Gamble *)&local_a8);
      cVar3 = *local_f8;
    }
    if (local_f0 == 1 && cVar3 == 'a') {
      CreditField::CreditField((CreditField *)&local_a8);
      CreditField::AddCredit((CreditField *)&local_a8,credits);
      CreditField::~CreditField((CreditField *)&local_a8);
      cVar3 = *local_f8;
    }
    if ((cVar3 == 'q') && (local_f0 == 1)) {
      SelectGame::SelectGame(&local_a8);
      SelectGame::selectGame_Welcome(&local_a8);
      SelectGame::selectGame_Games(&local_a8);
      SelectGame::selectGame_Option(&local_a8,credits);
      SelectGame::~SelectGame(&local_a8);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(");
      std::endl<char,std::char_traits<char>>(poVar2);
      CreditField::CreditField(&local_d0);
      CreditField::AddCredit(&local_d0,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You need to add atleast 1 Euro!");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::operator<<((ostream *)&std::cout,"Cashout: ");
        poVar2 = std::ostream::_M_insert<double>(*credits);
        poVar2 = std::operator<<(poVar2," Euro.");
        std::endl<char,std::char_traits<char>>(poVar2);
        *credits = 0.0;
        SelectGame::SelectGame(&local_a8);
        SelectGame::selectGame_Welcome(&local_a8);
        SelectGame::selectGame_Games(&local_a8);
        SelectGame::selectGame_Option(&local_a8,credits);
        SelectGame::~SelectGame(&local_a8);
      }
      CreditField::~CreditField(&local_d0);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&local_c8);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88._myVectorInPaytableSuperFire);
  std::__cxx11::string::~string((string *)&local_f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void Start::StartGameNow(double & credits, unsigned int& bet) {
	
	std::vector<std::vector<int>>myVectorInStart;
	myVectorInStart = getVectorMatrix();
	std::string p;
	
	unsigned int minBet = 1;
	PaytableSuperFire paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet <<" Euro!" << std::endl;
		}
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cout << "Press 'p' to Start a Game!" << std::endl;
			std::cout << "Press 'e' to Change the Bet!" << std::endl;
			std::cout << "Press 'i' to see the Paytable!" << std::endl;
			std::cout << "Press 'c' to Cashout!" << std::endl;
			std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
			std::cout << "Press 'a' to add credit!" << std::endl;
			std::cout << "Press 'q' for More Games!" << std::endl;
			std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
		
		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size()==1) {
			//clears screen
			if (system("CLS")) system("clear");

			takeCreditsWithBet(credits, bet);
			RandomNumbersInMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits,bet);
			paytableForGame.PaytableSuperFireWin(myVectorInStart,credits,bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBet(bet,credits );
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			paytableForGame.PaytableSuperFireInfo();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {
			
			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' &&p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
	
		if (credits < 1 ) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}
		
		myVectorInStart.clear();
	}
}